

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O0

int hydro_secretbox_probe_verify(uint8_t *probe,uint8_t *c,size_t c_len,char *ctx,uint8_t *key)

{
  _Bool _Var1;
  uint8_t *in_RDX;
  char *in_RSI;
  void *in_RDI;
  size_t unaff_retaddr;
  uint8_t *mac;
  uint8_t computed_probe [16];
  undefined1 local_48 [40];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDX < (uint8_t *)0x24) {
    iVar2 = -1;
  }
  else {
    hydro_hash_hash(mac,unaff_retaddr,
                    (void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (size_t)in_RDI,in_RSI,in_RDX);
    _Var1 = hydro_equal(local_48,in_RDI,0x10);
    if (_Var1) {
      iVar2 = 0;
    }
    else {
      hydro_memzero(local_48,0x10);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int
hydro_secretbox_probe_verify(const uint8_t probe[hydro_secretbox_PROBEBYTES], const uint8_t *c,
                             size_t c_len, const char ctx[hydro_secretbox_CONTEXTBYTES],
                             const uint8_t key[hydro_secretbox_KEYBYTES])
{
    uint8_t        computed_probe[hydro_secretbox_PROBEBYTES];
    const uint8_t *mac;

    if (c_len < hydro_secretbox_HEADERBYTES) {
        return -1;
    }
    mac = &c[hydro_secretbox_SIVBYTES];
    hydro_hash_hash(computed_probe, hydro_secretbox_PROBEBYTES, mac, hydro_secretbox_MACBYTES, ctx,
                    key);
    if (hydro_equal(computed_probe, probe, hydro_secretbox_PROBEBYTES) == 1) {
        return 0;
    }
    hydro_memzero(computed_probe, hydro_secretbox_PROBEBYTES);
    return -1;
}